

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaNotationPtr xmlSchemaGetNotation(xmlSchemaPtr schema,xmlChar *name,xmlChar *nsName)

{
  int iVar1;
  xmlSchemaNotationPtr pxVar2;
  void *pvVar3;
  char *name_00;
  
  if (schema != (xmlSchemaPtr)0x0 && name != (xmlChar *)0x0) {
    iVar1 = xmlStrEqual(nsName,schema->targetNamespace);
    if ((iVar1 != 0) &&
       (pxVar2 = (xmlSchemaNotationPtr)xmlHashLookup(schema->notaDecl,name),
       pxVar2 != (xmlSchemaNotationPtr)0x0)) {
      return pxVar2;
    }
    iVar1 = xmlHashSize(schema->schemasImports);
    if (1 < iVar1) {
      name_00 = "##";
      if (nsName != (xmlChar *)0x0) {
        name_00 = (char *)nsName;
      }
      pvVar3 = xmlHashLookup(schema->schemasImports,(xmlChar *)name_00);
      if (pvVar3 != (void *)0x0) {
        pxVar2 = (xmlSchemaNotationPtr)
                 xmlHashLookup(*(xmlHashTablePtr *)(*(long *)((long)pvVar3 + 0x50) + 0x58),name);
        return pxVar2;
      }
    }
  }
  return (xmlSchemaNotationPtr)0x0;
}

Assistant:

static xmlSchemaNotationPtr
xmlSchemaGetNotation(xmlSchemaPtr schema,
		     const xmlChar *name,
		     const xmlChar *nsName)
{
    xmlSchemaNotationPtr ret = NULL;

    if ((name == NULL) || (schema == NULL))
        return (NULL);
    if (schema != NULL) {
	WXS_FIND_GLOBAL_ITEM(notaDecl)
    }
exit:
    return (ret);
}